

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
person::msgpack_pack<msgpack::v1::packer<msgpack::v1::sbuffer>>
          (person *this,packer<msgpack::v1::sbuffer> *msgpack_pk)

{
  packer<msgpack::v1::sbuffer> *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  int *in_stack_ffffffffffffffe8;
  
  msgpack::v1::type::make_define_array<int_const,std::__cxx11::string_const,int_const>
            (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,(int *)in_stack_ffffffffffffffd8);
  msgpack::v1::type::define_array<int_const,std::__cxx11::string_const,int_const>::
  msgpack_pack<msgpack::v1::packer<msgpack::v1::sbuffer>>
            ((define_array<const_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_int>
              *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void test_get_person_name() {
  try {
    rpc_client client("127.0.0.1", 9000);
    bool r = client.connect();
    if (!r) {
      std::cout << "connect timeout" << std::endl;
      return;
    }

    auto result =
        client.call<std::string>("get_person_name", person{1, "tom", 20});
    std::cout << result << std::endl;
  } catch (const std::exception &e) {
    std::cout << e.what() << std::endl;
  }
}